

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frozen_benchmark.c
# Opt level: O1

void save(char *buf,size_t len)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  FILE *__stream;
  char *pcVar6;
  void *__ptr;
  size_t sVar7;
  void *__ptr_00;
  roaring_bitmap_t *prVar8;
  uint64_t uVar9;
  size_t __size;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  long extraout_RDX;
  char *pcVar14;
  uint uVar15;
  undefined8 *puVar16;
  char *pcVar17;
  ulong uVar18;
  undefined8 *puVar19;
  stat sStack_120;
  char *pcStack_90;
  void *pvStack_88;
  undefined8 *puStack_80;
  roaring_bitmap_t *prStack_78;
  char *pcStack_70;
  code *pcStack_68;
  long lStack_60;
  undefined8 *puStack_58;
  undefined8 *puStack_50;
  size_t sStack_48;
  
  uVar15 = 0x241;
  iVar3 = open("/tmp/roaring.bin",0x241,0x1b6);
  if (iVar3 != -1) {
    if (len != 0) {
      do {
        pcVar17 = buf;
        sVar5 = write(iVar3,buf,len);
        uVar15 = (uint)pcVar17;
        if (sVar5 == -1) {
          die("write");
          goto LAB_001013b1;
        }
        buf = buf + sVar5;
        len = len - sVar5;
      } while (len != 0);
    }
    close(iVar3);
    return;
  }
LAB_001013b1:
  pcVar17 = "open";
  die("open");
  if ((int)uVar15 < 1) {
    return;
  }
  puStack_50 = (undefined8 *)(ulong)uVar15;
  puVar19 = (undefined8 *)0x0;
  lStack_60 = extraout_RDX;
  sStack_48 = len;
LAB_001013e4:
  pcVar6 = *(char **)(lStack_60 + (long)puVar19 * 8);
  pcStack_68 = (code *)0x1013fb;
  __stream = fopen(pcVar6,"r");
  if (__stream == (FILE *)0x0) {
    pcStack_68 = (code *)0x101470;
    printf("Could not open file %s\n",pcVar6);
LAB_00101484:
    __ptr = (void *)0x0;
  }
  else {
    pcStack_68 = (code *)0x101412;
    fseek(__stream,0,2);
    pcStack_68 = (code *)0x10141a;
    pcVar6 = (char *)ftell(__stream);
    pcStack_68 = (code *)0x101425;
    rewind(__stream);
    pcStack_68 = (code *)0x10142e;
    __ptr = malloc((size_t)(pcVar6 + 1));
    if (__ptr == (void *)0x0) {
      pcStack_68 = (code *)0x10147a;
      fclose(__stream);
      goto LAB_00101484;
    }
    pcStack_68 = (code *)0x101449;
    sVar7 = fread(__ptr,(size_t)pcVar6,1,__stream);
    if (sVar7 != 1) {
      pcStack_68 = (code *)0x101484;
      free(__ptr);
      goto LAB_00101484;
    }
    *(char *)((long)__ptr + (long)pcVar6) = '\0';
    pcStack_68 = (code *)0x10145d;
    fclose(__stream);
  }
  if (__ptr != (void *)0x0) {
    pcVar6 = (char *)0x1;
    uVar18 = 0;
    do {
      if (*(char *)((long)__ptr + uVar18) == ',') {
        pcVar6 = pcVar6 + 1;
      }
      else if (*(char *)((long)__ptr + uVar18) == '\0') goto LAB_001014b6;
      uVar18 = uVar18 + 1;
    } while( true );
  }
  pcVar14 = (char *)0x0;
  __ptr_00 = (void *)0x0;
  goto LAB_001015ac;
code_r0x001014fb:
  uVar12 = uVar11;
  if (*(char *)((long)__ptr + uVar11) == '\0') goto code_r0x00101509;
  goto LAB_001014ef;
code_r0x00101509:
  iVar4 = 10;
LAB_00101551:
  if ((9 < bVar13) || (uVar12 = uVar11 + 1, iVar4 = iVar3, uVar18 <= uVar12)) goto LAB_00101579;
  goto LAB_001014e1;
LAB_001014b6:
  pcStack_68 = (code *)0x1014c3;
  puStack_58 = puVar19;
  __ptr_00 = malloc((long)pcVar6 * 4);
  puVar19 = puStack_58;
  if (__ptr_00 == (void *)0x0) {
    pcVar14 = (char *)0x0;
    __ptr_00 = (void *)0x0;
  }
  else {
    iVar3 = 5;
    if (uVar18 != 0) {
      uVar12 = 0;
      pcVar14 = (char *)0x0;
LAB_001014e1:
      iVar4 = iVar3;
      if (*(char *)((long)__ptr + uVar12) != '\0') {
LAB_001014ef:
        uVar11 = uVar12 + 1;
        bVar13 = *(char *)((long)__ptr + uVar12) - 0x30;
        if (9 < bVar13) goto code_r0x001014fb;
        uVar15 = (uint)bVar13;
        cVar1 = *(char *)((long)__ptr + uVar11);
        while ((byte)(cVar1 - 0x30U) < 10) {
          uVar15 = (uint)(byte)(cVar1 - 0x30) + uVar15 * 10;
          lVar2 = uVar11 + 1;
          uVar11 = uVar11 + 1;
          cVar1 = *(char *)((long)__ptr + lVar2);
        }
        *(uint *)((long)__ptr_00 + (long)pcVar14 * 4) = uVar15;
        pcVar14 = pcVar14 + 1;
        iVar4 = 0;
        goto LAB_00101551;
      }
      goto LAB_00101579;
    }
    pcVar14 = (char *)0x0;
    iVar4 = iVar3;
LAB_00101579:
    if ((iVar4 == 10) || (iVar4 == 5)) {
      if (pcVar14 != pcVar6) {
        pcStack_68 = (code *)0x1015a0;
        printf("unexpected number of integers! %d %d \n",(ulong)pcVar14 & 0xffffffff,
               (ulong)pcVar6 & 0xffffffff);
      }
      pcStack_68 = (code *)0x1015a8;
      free(__ptr);
    }
    else {
      pcVar14 = (char *)0x0;
    }
  }
LAB_001015ac:
  if (pcVar14 != (char *)0x0) {
    pcVar6 = (char *)0x0;
    do {
      pcStack_68 = (code *)0x1015c0;
      roaring_bitmap_add((roaring_bitmap_t *)pcVar17,
                         *(uint32_t *)((long)__ptr_00 + (long)pcVar6 * 4));
      pcVar6 = pcVar6 + 1;
    } while (pcVar14 != pcVar6);
    pcStack_68 = (code *)0x1015d0;
    free(__ptr_00);
    puVar19 = (undefined8 *)((long)puVar19 + 1);
    if (puVar19 == puStack_50) {
      return;
    }
    goto LAB_001013e4;
  }
  iVar3 = (int)lStack_60;
  pcStack_68 = main;
  puVar16 = puVar19;
  populate_cold_1();
  pcStack_90 = pcVar14;
  pvStack_88 = __ptr_00;
  puStack_80 = puVar19;
  prStack_78 = (roaring_bitmap_t *)pcVar17;
  pcStack_70 = pcVar6;
  pcStack_68 = (code *)__ptr;
  if (iVar3 < 2) {
    printf("Usage: %s <comma_separated_integers_file> ...\n",*puVar16);
    return;
  }
  prVar8 = roaring_bitmap_create_with_capacity(0);
  populate(prVar8,iVar3 + -1,(char **)(puVar16 + 1));
  uVar9 = roaring_bitmap_get_cardinality(prVar8);
  printf("Cardinality: %ld\n",uVar9);
  __size = roaring_bitmap_frozen_size_in_bytes(prVar8);
  printf("Serialized size [bytes]: %zu\n",__size);
  pcVar17 = (char *)malloc(__size);
  roaring_bitmap_frozen_serialize(prVar8,pcVar17);
  save(pcVar17,__size);
  free(pcVar17);
  free(prVar8);
  iVar3 = open("/tmp/roaring.bin",0);
  if (iVar3 == -1) {
    die("open");
  }
  else {
    iVar4 = fstat(iVar3,&sStack_120);
    if (iVar4 != -1) {
      pcVar17 = (char *)mmap((void *)0x0,sStack_120.st_size,1,1,iVar3,0);
      if (pcVar17 != (char *)0x0) {
        prVar8 = roaring_bitmap_frozen_view(pcVar17,sStack_120.st_size);
        uVar10 = malloc_usable_size(prVar8);
        printf("Allocation size [bytes]: %zu\n",uVar10);
        roaring_bitmap_free(prVar8);
        munmap(pcVar17,sStack_120.st_size);
        close(iVar3);
        return;
      }
      goto LAB_0010177b;
    }
  }
  die("fstat");
LAB_0010177b:
  pcVar17 = "mmap";
  die("mmap");
  lVar2 = 0;
  if (pcVar17 != (char *)0x0) {
    for (; ((ulong)pcVar17 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  return;
}

Assistant:

void save(const char *buf, size_t len) {
    int fd = open(FILENAME, O_WRONLY | O_CREAT | O_TRUNC, 0666);
    if (fd == -1) {
        die("open");
    }
    while (len > 0) {
        ssize_t res = write(fd, buf, len);
        if (res == -1) {
            die("write");
        }
        buf += res;
        len -= res;
    }
    close(fd);
}